

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_valid_Test::TestBody(unitOps_valid_Test *this)

{
  return;
}

Assistant:

TEST(unitOps, valid)
{
    EXPECT_FALSE(is_valid(invalid));
    EXPECT_TRUE(is_valid(defunit));
    EXPECT_TRUE(is_valid(V));
    EXPECT_TRUE(is_valid(unit(std::numeric_limits<double>::quiet_NaN(), m)));
    EXPECT_FALSE(is_valid(
        unit(std::numeric_limits<double>::quiet_NaN(), invalid.base_units())));
    EXPECT_FALSE(is_valid(unit(
        std::numeric_limits<double>::signaling_NaN(), invalid.base_units())));
}